

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::fixSolvabilityByOffset
          (MLCellLinOp *this,int amrlev,int mglev,Any *a_rhs,
          Vector<double,_std::allocator<double>_> *offset)

{
  bool bVar1;
  uint ncomp;
  FabArray<amrex::FArrayBox> *this_00;
  ulong uVar2;
  ulong uVar3;
  allocator_type local_51;
  value_type_conflict2 local_50;
  Vector<double,_std::allocator<double>_> val;
  
  this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)ncomp) {
    uVar2 = (ulong)ncomp;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    MultiFab::plus((MultiFab *)this_00,
                   -(offset->super_vector<double,_std::allocator<double>_>).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3],(int)uVar3,1,0);
  }
  bVar1 = FabArray<amrex::FArrayBox>::hasEBFabFactory(this_00);
  if (bVar1) {
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&val.super_vector<double,_std::allocator<double>_>,(long)(int)ncomp,&local_50,
               &local_51);
    EB_set_covered((MultiFab *)this_00,0,ncomp,
                   (Vector<double,_std::allocator<double>_> *)
                   &val.super_vector<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&val);
  }
  return;
}

Assistant:

void
MLCellLinOp::fixSolvabilityByOffset (int amrlev, int mglev, Any& a_rhs,
                                     Vector<Real> const& offset) const
{
    amrex::ignore_unused(amrlev, mglev);
    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto& rhs = a_rhs.get<MultiFab>();

    const int ncomp = getNComp();
    for (int c = 0; c < ncomp; ++c) {
        rhs.plus(-offset[c], c, 1);
    }
#ifdef AMREX_USE_EB
    if (rhs.hasEBFabFactory()) {
        Vector<Real> val(ncomp, 0.0_rt);
        amrex::EB_set_covered(rhs, 0, ncomp, val);
    }
#endif
}